

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O3

switch_strings * __thiscall
pstore::command_line::details::get_switch_strings_abi_cxx11_
          (switch_strings *__return_storage_ptr__,details *this,options_set *ops)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *str_00;
  ulong new_elements;
  ulong uVar2;
  int iVar3;
  string *str_01;
  size_t sVar4;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined4 extraout_var_00;
  mapped_type *sm;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ptVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  char cVar7;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char separator [3];
  string str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  name;
  char local_bc [4];
  undefined1 local_b8 [8];
  char *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  switch_strings *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_bc[2] = 0;
  local_bc[0] = ',';
  local_bc[1] = ' ';
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = *(_Rb_tree_node_base **)(this + 0x18);
  local_60 = (_Rb_tree_node_base *)(this + 8);
  local_90 = __return_storage_ptr__;
  if (local_58 != local_60) {
    do {
      this_00 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(local_58 + 1);
      str_01 = option::name_abi_cxx11_((option *)this_00);
      sVar4 = utf::length(str_01);
      local_b8 = (undefined1  [8])&local_a8;
      local_b0 = (char *)0x0;
      local_a8._M_local_buf[0] = '\0';
      if (sVar4 < 2) {
        std::operator+(&local_50,"-",str_01);
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar8 = 1;
      }
      else {
        std::operator+(&local_50,"--",str_01);
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar8 = 2;
      }
      iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x70))(this_00);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(lVar8 + sVar4);
      if ((char)iVar3 != '\0') {
        iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x88))(this_00);
        if ((czstring)CONCAT44(extraout_var,iVar3) != (czstring)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x2 < paVar9) {
            std::__cxx11::string::append((char *)local_b8);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)paVar9 + 1);
          }
          cVar7 = (char)(string *)local_b8;
          std::__cxx11::string::push_back(cVar7);
          std::__cxx11::string::append((char *)local_b8);
          std::__cxx11::string::push_back(cVar7);
          sVar4 = utf::length((czstring)CONCAT44(extraout_var,iVar3));
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar9->_M_local_buf + sVar4 + 2);
        }
      }
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)utf::length((string *)local_b8);
      if (paVar5 != paVar9) {
        assert_failed("pstore::utf::length (str) == code_points",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x56);
      }
      local_88._M_allocated_capacity = (size_type)&local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_b8,local_b0 + (long)local_b8);
      local_68 = paVar9;
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,
                        CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1)
        ;
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)utf::length((string *)&local_88);
      if (paVar9 != local_68) {
        assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                      ,0x8b);
      }
      iVar3 = (**(code **)(this_00->_M_allocated_capacity + 0x60))(this_00);
      if (CONCAT44(extraout_var_00,iVar3) != 0) {
        this_00 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(CONCAT44(extraout_var_00,iVar3) + 0x88);
      }
      local_b8 = (undefined1  [8])this_00;
      gsl::not_null<const_pstore::command_line::option_*>::ensure_invariant
                ((not_null<const_pstore::command_line::option_*> *)local_b8);
      sm = std::
           map<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
           ::operator[](local_90,(key_type *)local_b8);
      if ((sm->elements_ == 0) ||
         (ptVar6 = small_vector<std::tuple<std::__cxx11::string,unsigned_long>,1ul>::
                   index<pstore::small_vector<std::tuple<std::__cxx11::string,unsigned_long>,1ul>&,std::tuple<std::__cxx11::string,unsigned_long>>
                             (sm,sm->elements_ - 1),
         (char *)0x14 <
         local_68->_M_local_buf +
         (ptVar6->
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
         ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl + 2)) {
        local_b8 = (undefined1  [8])local_68;
        local_b0 = local_a8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_88._M_allocated_capacity,
                   local_88._8_8_ + local_88._M_allocated_capacity);
        uVar2 = sm->elements_;
        new_elements = uVar2 + 1;
        if (new_elements < 2) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(&sm->small_buffer_)[uVar2]._M_elems[0].
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    );
          (&sm->small_buffer_)[uVar2]._M_elems[0].
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          .super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
          _M_head_impl = (unsigned_long)local_b8;
        }
        else {
          if (uVar2 < 2) {
            small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
            ::switch_to_big(sm,new_elements);
          }
          std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::push_back(&sm->big_buffer_,(value_type *)local_b8);
          sm->buffer_ = (sm->big_buffer_).
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        sm->elements_ = new_elements;
        if (local_b0 != local_a8._M_local_buf + 8) {
          operator_delete(local_b0,local_a8._8_8_ + 1);
        }
      }
      else {
        std::operator+((string *)local_b8,local_bc,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88);
        str_00 = &(ptVar6->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  ).
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ;
        std::__cxx11::string::_M_append((char *)str_00,(ulong)local_b8);
        if (local_b8 != (undefined1  [8])&local_a8) {
          operator_delete((void *)local_b8,
                          CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) +
                          1);
        }
        (ptVar6->
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (unsigned_long)
                       (local_68->_M_local_buf +
                       (ptVar6->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                       ).super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + 2);
        sVar4 = utf::length(&str_00->_M_head_impl);
        if (sVar4 != (ptVar6->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                     ).super__Tuple_impl<1UL,_unsigned_long>.
                     super__Head_base<1UL,_unsigned_long,_false>._M_head_impl) {
          assert_failed("pstore::utf::length (prev_string) == prev_code_points",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/help.cpp"
                        ,0x9e);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
      }
      local_58 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58);
    } while (local_58 != local_60);
  }
  return local_90;
}

Assistant:

auto get_switch_strings (options_set const & ops) -> switch_strings {
                    constexpr char const separator[] = ", ";
                    constexpr auto separator_len = array_elements (separator) - 1U;

                    switch_strings names;
                    for (option const * op : ops) {
                        std::pair<std::string, std::size_t> name = option_string (*op);
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));

                        if (alias const * const alias = op->as_alias ()) {
                            op = alias->original ();
                        }

                        auto & v = names[op];
                        if (!v.empty ()) {
                            auto & prev = v.back ();
                            auto & prev_string = std::get<std::string> (prev);
                            auto & prev_code_points = std::get<std::size_t> (prev);

                            if (prev_code_points + separator_len + std::get<std::size_t> (name) <=
                                overlong_opt_max) {
                                // Fold this string onto the same output line as its predecessor.
                                prev_string += separator + std::get<std::string> (name);
                                prev_code_points += separator_len + std::get<std::size_t> (name);

                                PSTORE_ASSERT (pstore::utf::length (prev_string) ==
                                               prev_code_points);
                                continue;
                            }
                        }
                        v.push_back (name);
                    }
                    return names;
                }